

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O1

void MGARD::data_reorder_3D<float>
               (float *data_pos,float *data_buffer,size_t n1,size_t n2,size_t n3,size_t dim0_stride,
               size_t dim1_stride)

{
  float *pfVar1;
  size_t sVar2;
  float *pfVar3;
  size_t sVar4;
  
  sVar2 = n1;
  pfVar3 = data_pos;
  if (n1 != 0) {
    do {
      data_reorder_2D<float>(pfVar3,data_buffer,n2,n3,dim1_stride);
      pfVar3 = pfVar3 + dim0_stride;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  if (n2 != 0 && (n1 & 1) == 0) {
    pfVar1 = pfVar3 + -dim0_stride;
    pfVar3 = pfVar3 + dim0_stride * -2;
    sVar2 = 0;
    do {
      if (n3 != 0) {
        sVar4 = 0;
        do {
          pfVar1[sVar4] = (pfVar1[sVar4] + pfVar1[sVar4]) - pfVar3[sVar4];
          sVar4 = sVar4 + 1;
        } while (n3 != sVar4);
      }
      sVar2 = sVar2 + 1;
      pfVar3 = pfVar3 + dim1_stride;
      pfVar1 = pfVar1 + dim1_stride;
    } while (sVar2 != n2);
  }
  if (n2 != 0) {
    do {
      switch_rows_2D_by_buffer<float>(data_pos,data_buffer,n1,n3,dim0_stride);
      data_pos = data_pos + dim1_stride;
      n2 = n2 - 1;
    } while (n2 != 0);
  }
  return;
}

Assistant:

void data_reorder_3D(T * data_pos, T * data_buffer, size_t n1, size_t n2, size_t n3, size_t dim0_stride, size_t dim1_stride){
    size_t n1_nodal = (n1 >> 1) + 1;
    size_t n1_coeff = n1 - n1_nodal;
    size_t n2_nodal = (n2 >> 1) + 1;
    size_t n2_coeff = n2 - n2_nodal;
    size_t n3_nodal = (n3 >> 1) + 1;
    size_t n3_coeff = n3 - n3_nodal;
    T * cur_data_pos = data_pos;
    // do 2D reorder
    for(int i=0; i<n1; i++){
        data_reorder_2D(cur_data_pos, data_buffer, n2, n3, dim1_stride);
        cur_data_pos += dim0_stride;
    }
    if(!(n1 & 1)){
        // n1 is even, change the last coeff plane into nodal plane
        cur_data_pos -= dim0_stride;
        for(int j=0; j<n2; j++){
            for(int k=0; k<n3; k++){
                cur_data_pos[k] = 2 * cur_data_pos[k] - cur_data_pos[- dim0_stride + k];
            }
            cur_data_pos += dim1_stride;
        }
    }
    cur_data_pos = data_pos;
    // reorder vertically
    for(int j=0; j<n2; j++){
        switch_rows_2D_by_buffer(cur_data_pos, data_buffer, n1, n3, dim0_stride);
        cur_data_pos += dim1_stride;
    }
}